

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CordInputStream::Next(CordInputStream *this,void **data,int *size)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = this->available_;
  if (sVar2 == 0) {
    bVar1 = NextChunk(this,0);
    if (!bVar1) {
      return false;
    }
    sVar2 = this->available_;
  }
  *data = this->data_ + (this->size_ - sVar2);
  *size = (int)sVar2;
  this->bytes_remaining_ = this->bytes_remaining_ - sVar2;
  this->available_ = 0;
  return true;
}

Assistant:

bool CordInputStream::Next(const void** data, int* size) {
  if (available_ > 0 || NextChunk(0)) {
    *data = data_ + size_ - available_;
    *size = available_;
    bytes_remaining_ -= available_;
    available_ = 0;
    return true;
  }
  return false;
}